

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O0

void __thiscall helics::apps::App::loadTextFile(App *this,string *textFile)

{
  AppTextParser *in_RDI;
  AppTextParser aparser;
  _Vector_impl *this_00;
  string *in_stack_fffffffffffffd58;
  AppTextParser *in_stack_fffffffffffffd60;
  _Vector_impl local_298 [9];
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  AppTextParser *in_stack_fffffffffffffe48;
  AppTextParser *in_stack_fffffffffffffed8;
  App *in_stack_fffffffffffffee0;
  
  AppTextParser::AppTextParser(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  local_298[0].super__Tp_alloc_type = (_Tp_alloc_type)0x0;
  local_298[0]._1_7_ = 0;
  local_298[0]._8_8_ = 0;
  local_298[0]._16_8_ = 0;
  this_00 = local_298;
  CLI::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)0x207eeb);
  AppTextParser::preParseFile(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  CLI::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00)
  ;
  CLI::std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)this_00);
  loadConfigOptions(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  AppTextParser::~AppTextParser(in_RDI);
  return;
}

Assistant:

void App::loadTextFile(const std::string& textFile)
{
    AppTextParser aparser(textFile);
    aparser.preParseFile({});
    loadConfigOptions(aparser);
}